

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O2

void Show_Dialog_Centered(Am_Object *dlg,Am_Object *win)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Am_Value *pAVar7;
  ushort uVar8;
  Am_Object local_38;
  
  uVar8 = (ushort)win;
  pAVar7 = (Am_Value *)Am_Object::Get(uVar8,100);
  iVar1 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = (Am_Value *)Am_Object::Get(uVar8,0x66);
  iVar2 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = (Am_Value *)Am_Object::Get(uVar8,0x65);
  iVar3 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = (Am_Value *)Am_Object::Get(uVar8,0x67);
  iVar4 = Am_Value::operator_cast_to_int(pAVar7);
  uVar8 = (ushort)dlg;
  pAVar7 = (Am_Value *)Am_Object::Get(uVar8,0x66);
  iVar5 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = (Am_Value *)Am_Object::Get(uVar8,0x67);
  iVar6 = Am_Value::operator_cast_to_int(pAVar7);
  Am_Object::Set(uVar8,100,(ulong)(uint)(iVar1 + (iVar2 - iVar5) / 2));
  Am_Object::Set(uVar8,0x65,(ulong)(uint)(iVar3 + (iVar4 - iVar6) / 2));
  Am_Object::Set(uVar8,true,1);
  Am_Object::Am_Object(&local_38,dlg);
  Am_To_Top((Am_Object_Data *)&local_38);
  Am_Object::~Am_Object(&local_38);
  return;
}

Assistant:

void
Show_Dialog_Centered(Am_Object dlg, Am_Object win)
{
  // center save dialog within the current win
  int win_left = win.Get(Am_LEFT);
  int win_width = win.Get(Am_WIDTH);
  int win_top = win.Get(Am_TOP);
  int win_height = win.Get(Am_HEIGHT);
  int dlg_width = dlg.Get(Am_WIDTH);
  int dlg_height = dlg.Get(Am_HEIGHT);
  dlg.Set(Am_LEFT, win_left + (win_width - dlg_width) / 2);
  dlg.Set(Am_TOP, win_top + (win_height - dlg_height) / 2);

  // show it
  dlg.Set(Am_VISIBLE, true);
  Am_To_Top(dlg);
}